

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void __thiscall
chrono::utils::GridSampler<double>::SetSeparation(GridSampler<double> *this,double separation)

{
  (this->m_sep3D).m_data[0] = separation;
  (this->m_sep3D).m_data[1] = separation;
  (this->m_sep3D).m_data[2] = separation;
  return;
}

Assistant:

inline ChVector<Real>& ChVector<Real>::operator=(const ChVector<Real>& other) {
    if (&other == this)
        return *this;
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
    return *this;
}